

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::iterate(BufferAgeTest *this)

{
  TestLog *log;
  TestContext *pTVar1;
  pointer pFVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  EGLint EVar6;
  EGLint EVar7;
  deUint32 dVar8;
  int iVar9;
  Library *egl;
  ulong uVar10;
  pointer __result;
  pointer pFVar11;
  pointer __last;
  ostream *poVar12;
  int iVar13;
  _Tp_alloc_type *__alloc;
  Frame *__args;
  Frame *extraout_RDX;
  size_t __n;
  Frame *extraout_RDX_00;
  Frame *pFVar14;
  Frame *extraout_RDX_01;
  Frame *frame;
  _func_int **pp_Var15;
  uint frameNdx;
  char *message;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  EGLint currentBufferAge;
  Library *local_2e0;
  int local_2d8;
  int local_2d4;
  Functions *local_2d0;
  FrameSequence frameSequence;
  Vec4 clearColor;
  uint local_298;
  undefined4 uStack_294;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  vector<int,_std::allocator<int>_> bufferAges;
  Random rnd;
  ostringstream stream;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar6 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  EVar7 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar19 = deRandom_getFloat(&rnd.m_rnd);
  fVar20 = deRandom_getFloat(&rnd.m_rnd);
  local_2e0 = (Library *)CONCAT44(local_2e0._4_4_,fVar20);
  clearColor.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[1] = local_2e0._0_4_;
  clearColor.m_data[3] = 1.0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2e0 = egl;
  clearColor.m_data[0] = fVar19;
  if (this->m_preserveColorBuffer == true) {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
    dVar8 = (*local_2e0->_vptr_Library[0x1f])();
    iVar13 = 499;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)";
  }
  else {
    (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
    dVar8 = (*local_2e0->_vptr_Library[0x1f])();
    iVar13 = 0x1f5;
    message = "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)";
  }
  eglu::checkError(dVar8,message,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                   ,iVar13);
  local_2d0 = &this->m_gl;
  iVar9 = EVar7 / 2;
  iVar13 = EVar6 * 2;
  __last = (pointer)0x0;
  local_2d8 = EVar7;
  local_2d4 = EVar6;
  for (frameNdx = 0; iVar4 = local_2d4, iVar3 = local_2d8, frameNdx != 0x14; frameNdx = frameNdx + 1
      ) {
    tcu::Surface::Surface(&currentBuffer,local_2d4,local_2d8);
    tcu::Surface::Surface(&refBuffer,iVar4,iVar3);
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newFrame.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    currentBufferAge = -1;
    drawTypes = &this->m_oddFrameDrawType;
    if ((frameNdx & 1) == 0) {
      drawTypes = &this->m_evenFrameDrawType;
    }
    newFrame.width = iVar4;
    newFrame.height = iVar3;
    generateRandomFrame(&newFrame,drawTypes,&rnd);
    pFVar2 = frameSequence.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__last == frameSequence.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)__last -
          (long)frameSequence.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar17 = (long)__last -
               (long)frameSequence.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar10 = uVar17;
      if (__last == frameSequence.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 1;
      }
      uVar18 = uVar10 + uVar17;
      __alloc = (_Tp_alloc_type *)0x3ffffffffffffff;
      if (0x3fffffffffffffe < uVar18) {
        uVar18 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar10,uVar17)) {
        uVar18 = 0x3ffffffffffffff;
      }
      if (uVar18 == 0) {
        __result = (pointer)0x0;
        pFVar14 = __args;
      }
      else {
        __result = (pointer)operator_new(uVar18 << 5);
        pFVar14 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(__result + uVar17),&newFrame,pFVar14);
      pFVar11 = std::
                vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ::_S_relocate(pFVar2,__last,__result,__alloc);
      __last = std::
               vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ::_S_relocate(__last,__last,pFVar11 + 1,__alloc);
      std::
      _Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                       *)pFVar2,
                      (pointer)((long)frameSequence.
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pFVar2 >> 5),__n);
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar18;
      frameSequence.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)__last,&newFrame,__args);
      __last = __last + 1;
    }
    frameSequence.
    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = __last;
    (*local_2e0->_vptr_Library[0x2b])
              (local_2e0,this->m_eglDisplay,this->m_eglSurface,0x313d,&currentBufferAge);
    dVar8 = (*local_2e0->_vptr_Library[0x1f])();
    eglu::checkError(dVar8,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x205);
    if (frameNdx < (uint)currentBufferAge) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
      poVar12 = std::operator<<((ostream *)&stream,"Fail, the age is invalid. Age: ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,currentBufferAge);
      poVar12 = std::operator<<(poVar12,", frameNdx: ");
      std::ostream::operator<<(poVar12,frameNdx);
      pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult
                (pTVar1,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_294,local_298));
LAB_00def92a:
      bVar5 = true;
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
    }
    else {
      if (((frameNdx != 0) && (currentBufferAge != 1)) && (this->m_preserveColorBuffer != false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
        poVar12 = std::operator<<((ostream *)&stream,
                                  "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,currentBufferAge);
        std::operator<<(poVar12," (should be 1)");
        pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        std::__cxx11::stringbuf::str();
        tcu::TestContext::setTestResult
                  (pTVar1,QP_TEST_RESULT_FAIL,(char *)CONCAT44(uStack_294,local_298));
        goto LAB_00def92a;
      }
      std::vector<int,_std::allocator<int>_>::push_back(&bufferAges,&currentBufferAge);
      if (frameNdx < 10) {
        if (currentBufferAge == 0) {
          clearColorScreen(local_2d0,&clearColor);
        }
        GLES2Renderer::render(this->m_gles2Renderer,local_2d4,local_2d8,&newFrame);
        if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
          if ((frameNdx & 1) == 0) {
            piVar16 = &local_240;
            local_240 = iVar13;
            local_23c = iVar9;
          }
          else {
            piVar16 = &local_248;
            local_248 = iVar9;
            local_244 = iVar13;
          }
          (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar16);
        }
        (*local_2e0->_vptr_Library[0x31])(local_2e0,this->m_eglDisplay,this->m_eglSurface);
        dVar8 = (*local_2e0->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,"swapBuffers(m_eglDisplay, m_eglSurface)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                         ,0x22a);
        bVar5 = false;
        if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
          iVar3 = iVar9;
          iVar4 = iVar13;
          if ((frameNdx & 1) == 0) {
            iVar3 = local_258;
            iVar4 = local_254;
            local_250 = iVar13;
            local_24c = iVar9;
          }
          local_254 = iVar4;
          local_258 = iVar3;
          (*this->m_window->_vptr_NativeWindow[6])();
          bVar5 = false;
        }
      }
      else {
        if (currentBufferAge < 1) {
          clearColorScreen(local_2d0,&clearColor);
          clearColorReference(&refBuffer,&clearColor);
        }
        else {
          stream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)0x0;
          stream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
          stream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
          local_298 = frameNdx;
          while (bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)local_298] != 0) {
            local_298 = local_298 -
                        bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)local_298];
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&stream,
                       (value_type_conflict1 *)&local_298);
          }
          std::__reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (stream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                     stream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
          anon_unknown_0::readPixels(local_2d0,&currentBuffer);
          clearColorReference(&refBuffer,&clearColor);
          pFVar2 = frameSequence.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pFVar14 = extraout_RDX_00;
          for (pp_Var15 = stream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream;
              pp_Var15 !=
              (_func_int **)stream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
              pp_Var15 = (_func_int **)((long)pp_Var15 + 4)) {
            ReferenceRenderer::render
                      ((ReferenceRenderer *)&refBuffer,(Surface *)(pFVar2 + *(int *)pp_Var15),
                       pFVar14);
            pFVar14 = extraout_RDX_01;
          }
          bVar5 = compareToReference(log,&refBuffer,&currentBuffer,frameNdx,
                                     frameNdx - currentBufferAge);
          if (!bVar5) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail, buffer content is not well preserved when age > 0"
                      );
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&stream);
            bVar5 = true;
            goto LAB_00def93c;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&stream);
        }
        GLES2Renderer::render(this->m_gles2Renderer,local_2d4,local_2d8,&newFrame);
        ReferenceRenderer::render((ReferenceRenderer *)&refBuffer,(Surface *)&newFrame,frame);
        anon_unknown_0::readPixels(local_2d0,&currentBuffer);
        bVar5 = compareToReference(log,&refBuffer,&currentBuffer,frameNdx,frameNdx);
        if (bVar5) {
          if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
            if ((frameNdx & 1) == 0) {
              piVar16 = &local_260;
              local_260 = iVar13;
              local_25c = iVar9;
            }
            else {
              piVar16 = &local_268;
              local_268 = iVar9;
              local_264 = iVar13;
            }
            (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar16);
          }
          (*local_2e0->_vptr_Library[0x31])(local_2e0,this->m_eglDisplay,this->m_eglSurface);
          dVar8 = (*local_2e0->_vptr_Library[0x1f])();
          eglu::checkError(dVar8,"swapBuffers(m_eglDisplay, m_eglSurface)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                           ,0x260);
          bVar5 = false;
          if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
            iVar3 = iVar9;
            iVar4 = iVar13;
            if ((frameNdx & 1) == 0) {
              iVar3 = local_278;
              iVar4 = local_274;
              local_270 = iVar13;
              local_26c = iVar9;
            }
            local_274 = iVar4;
            local_278 = iVar3;
            (*this->m_window->_vptr_NativeWindow[6])();
          }
        }
        else {
          bVar5 = true;
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail, render result is wrong");
        }
      }
    }
LAB_00def93c:
    Frame::~Frame(&newFrame);
    tcu::Surface::~Surface(&refBuffer);
    tcu::Surface::~Surface(&currentBuffer);
    if (bVar5) goto LAB_00defdf1;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_00defdf1:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bufferAges.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&frameSequence);
  return STOP;
}

Assistant:

TestCase::IterateResult BufferAgeTest::iterate (void)
{
	de::Random		rnd					(m_seed);
	const Library&	egl					= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log					= m_testCtx.getLog();
	const int		width				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed			= rnd.getFloat();
	const float		clearGreen			= rnd.getFloat();
	const float		clearBlue			= rnd.getFloat();
	const tcu::Vec4	clearColor			(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames			= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;

	if (m_preserveColorBuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));
	else
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface					currentBuffer			(width, height);
		tcu::Surface					refBuffer				(width, height);
		Frame							newFrame				(width, height);
		EGLint							currentBufferAge		= -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(&newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(&newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		if (frameNdx > 0 && m_preserveColorBuffer && currentBufferAge != 1)
		{
			std::ostringstream stream;
			stream << "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: " << currentBufferAge << " (should be 1)";
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
		{
			if (currentBufferAge == 0)
				clearColorScreen(m_gl, clearColor);

			m_gles2Renderer->render(width, height, newFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			continue;
		}

		// do verification in the second half
		if (currentBufferAge > 0) //buffer contain previous content, need to verify
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);
			readPixels(m_gl, &currentBuffer);
			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx-currentBufferAge) == false)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, buffer content is not well preserved when age > 0");
				return STOP;
			}
		}
		else // currentBufferAge == 0, content is undefined, clear the buffer, currentBufferAge < 0 is ruled out at the beginning
		{
			clearColorScreen(m_gl, clearColor);
			clearColorReference(&refBuffer, clearColor);
		}

		m_gles2Renderer->render(width, height, newFrame);
		m_refRenderer->render(&refBuffer, newFrame);

		readPixels(m_gl, &currentBuffer);

		if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx) == false)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, render result is wrong");
			return STOP;
		}

		if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}

		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

		if (m_resizeType == RESIZETYPE_AFTER_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}